

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::ConditionalBranchDirectiveSyntax::isKind(SyntaxKind kind)

{
  bool local_9;
  SyntaxKind kind_local;
  
  if (((kind == ElsIfDirective) || (kind == IfDefDirective)) || (kind == IfNDefDirective)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool ConditionalBranchDirectiveSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::ElsIfDirective:
        case SyntaxKind::IfDefDirective:
        case SyntaxKind::IfNDefDirective:
            return true;
        default:
            return false;
    }
}